

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aes.c
# Opt level: O0

int aes_wrap_cipher(void *vctx,uchar *out,size_t *outl,size_t outsize,uchar *in,size_t inl)

{
  int iVar1;
  ulong in_RCX;
  long *in_RDX;
  char *in_RDI;
  char *in_R8;
  ulong in_R9;
  size_t len;
  PROV_AES_WRAP_CTX *ctx;
  char *inlen;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  inlen = in_RDI;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else if (in_R9 == 0) {
    *in_RDX = 0;
    iVar1 = 1;
  }
  else if (in_RCX < in_R9) {
    ERR_new();
    ERR_set_debug(in_R8,(int)(in_R9 >> 0x20),in_RDI);
    ERR_set_error(0x39,0x6a,(char *)0x0);
    iVar1 = 0;
  }
  else {
    iVar1 = aes_wrap_cipher_internal
                      (ctx,(uchar *)len,
                       (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (size_t)inlen);
    if ((long)iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      *in_RDX = (long)iVar1;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int aes_wrap_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out,
                           const unsigned char *in, size_t inlen)
{
    EVP_AES_WRAP_CTX *wctx = EVP_C_DATA(EVP_AES_WRAP_CTX,ctx);
    size_t rv;
    /* AES wrap with padding has IV length of 4, without padding 8 */
    int pad = EVP_CIPHER_CTX_get_iv_length(ctx) == 4;
    /* No final operation so always return zero length */
    if (!in)
        return 0;
    /* Input length must always be non-zero */
    if (!inlen)
        return -1;
    /* If decrypting need at least 16 bytes and multiple of 8 */
    if (!EVP_CIPHER_CTX_is_encrypting(ctx) && (inlen < 16 || inlen & 0x7))
        return -1;
    /* If not padding input must be multiple of 8 */
    if (!pad && inlen & 0x7)
        return -1;
    if (ossl_is_partially_overlapping(out, in, inlen)) {
        ERR_raise(ERR_LIB_EVP, EVP_R_PARTIALLY_OVERLAPPING);
        return 0;
    }
    if (!out) {
        if (EVP_CIPHER_CTX_is_encrypting(ctx)) {
            /* If padding round up to multiple of 8 */
            if (pad)
                inlen = (inlen + 7) / 8 * 8;
            /* 8 byte prefix */
            return inlen + 8;
        } else {
            /*
             * If not padding output will be exactly 8 bytes smaller than
             * input. If padding it will be at least 8 bytes smaller but we
             * don't know how much.
             */
            return inlen - 8;
        }
    }
    if (pad) {
        if (EVP_CIPHER_CTX_is_encrypting(ctx))
            rv = CRYPTO_128_wrap_pad(&wctx->ks.ks, wctx->iv,
                                     out, in, inlen,
                                     (block128_f) AES_encrypt);
        else
            rv = CRYPTO_128_unwrap_pad(&wctx->ks.ks, wctx->iv,
                                       out, in, inlen,
                                       (block128_f) AES_decrypt);
    } else {
        if (EVP_CIPHER_CTX_is_encrypting(ctx))
            rv = CRYPTO_128_wrap(&wctx->ks.ks, wctx->iv,
                                 out, in, inlen, (block128_f) AES_encrypt);
        else
            rv = CRYPTO_128_unwrap(&wctx->ks.ks, wctx->iv,
                                   out, in, inlen, (block128_f) AES_decrypt);
    }
    return rv ? (int)rv : -1;
}